

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.cpp
# Opt level: O1

size_t __thiscall NULLCString::strlen(NULLCString *this,char *__s)

{
  long lVar1;
  size_t sVar2;
  uint uVar3;
  char *error;
  size_t sVar4;
  bool bVar5;
  
  uVar3 = (uint)__s;
  if (this == (NULLCString *)0x0) {
    error = "string is null";
  }
  else {
    error = "string is not null-terminated";
    bVar5 = uVar3 != 0;
    if (bVar5) {
      if (*this == (NULLCString)0x0) {
        sVar2 = 0;
      }
      else {
        sVar4 = 0;
        do {
          if (uVar3 - 1 == (int)sVar4) goto LAB_002379cf;
          sVar2 = sVar4 + 1;
          lVar1 = sVar4 + 1;
          sVar4 = sVar2;
        } while (this[lVar1] != (NULLCString)0x0);
        bVar5 = (uint)sVar2 < uVar3;
      }
      if (bVar5) {
        return sVar2;
      }
    }
  }
LAB_002379cf:
  nullcThrowError(error);
  return 0xffffffff;
}

Assistant:

int strlen(NULLCArray string)
	{
		if(!string.ptr)
		{
			nullcThrowError("string is null");
			return -1;
		}

		for(unsigned i = 0; i < string.len; i++)
		{
			if(!string.ptr[i])
				return i;
		}

		nullcThrowError("string is not null-terminated");
		return -1;
	}